

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

_Bool av1_cnn_predict_img_multi_out_highbd
                (uint16_t **dgd,int width,int height,int stride,CNN_CONFIG *cnn_config,
                CNN_THREAD_DATA *thread_data,int bit_depth,CNN_MULTI_OUT *output)

{
  long lVar1;
  float *pfVar2;
  size_t __n;
  uint uVar3;
  long lVar4;
  _Bool _Var5;
  int in_height;
  int iVar6;
  void *memblk;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int j;
  ulong uVar19;
  float *pfVar20;
  int j_1;
  int iVar21;
  float *pfVar22;
  int in_width;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  float *inputs [256];
  
  lVar8 = (long)width;
  lVar1 = lVar8 + (long)cnn_config->ext_width * 2;
  uVar3 = cnn_config->layer_config[0].in_channels;
  in_height = height + cnn_config->ext_height * 2;
  in_width = (int)lVar1;
  iVar6 = in_height * in_width;
  memblk = aom_malloc((long)(int)(iVar6 * uVar3) << 2);
  _Var5 = false;
  if (memblk != (void *)0x0) {
    fVar28 = (float)~(-1 << ((byte)bit_depth & 0x1f));
    __n = lVar1 * 4;
    uVar12 = 0;
    if (0 < width) {
      uVar12 = (ulong)(uint)width;
    }
    uVar10 = 0;
    if (0 < height) {
      uVar10 = (ulong)(uint)height;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    lVar4 = (long)stride * 2;
    iVar9 = 0;
    for (uVar26 = 0; uVar26 != uVar3; uVar26 = uVar26 + 1) {
      lVar25 = (long)iVar9 * 4;
      pfVar2 = (float *)((long)memblk + (long)(iVar6 * (int)uVar26) * 4);
      inputs[uVar26] = pfVar2;
      iVar21 = cnn_config->ext_height;
      lVar11 = (long)(iVar21 * in_width);
      iVar23 = cnn_config->ext_width;
      lVar13 = (long)iVar23;
      if (cnn_config->strict_bounds == 0) {
        iVar7 = -iVar21;
        iVar15 = -iVar23;
        lVar16 = (long)iVar15;
        iVar24 = width + iVar23;
        if (width + iVar23 < iVar15) {
          iVar24 = iVar15;
        }
        lVar17 = (long)iVar7;
        iVar23 = iVar21 + height;
        if (iVar21 + height < iVar7) {
          iVar23 = iVar7;
        }
        lVar13 = __n * lVar17 + lVar13 * 4 + lVar25 + lVar11 * 4 + lVar16 * 4 + (long)memblk;
        lVar11 = lVar4 * lVar17 + lVar16 * 2;
        for (; lVar17 != iVar23; lVar17 = lVar17 + 1) {
          for (lVar25 = 0; iVar24 - lVar16 != lVar25; lVar25 = lVar25 + 1) {
            *(float *)(lVar13 + lVar25 * 4) =
                 (float)*(ushort *)((long)dgd[uVar26] + lVar25 * 2 + lVar11) / fVar28;
          }
          lVar13 = lVar13 + __n;
          lVar11 = lVar11 + lVar4;
        }
      }
      else {
        lVar16 = lVar25 + lVar13 * 4 + lVar11 * 4 + (long)memblk;
        lVar17 = 0;
        for (uVar18 = 0; uVar18 != uVar10; uVar18 = uVar18 + 1) {
          for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
            *(float *)(lVar16 + uVar19 * 4) =
                 (float)*(ushort *)((long)dgd[uVar26] + uVar19 * 2 + lVar17) / fVar28;
          }
          lVar16 = lVar16 + __n;
          lVar17 = lVar17 + lVar4;
        }
        uVar14 = -iVar23;
        uVar18 = 0;
        if (iVar23 < 0) {
          uVar18 = (ulong)uVar14;
        }
        lVar25 = lVar13 * 4 + lVar25 + lVar11 * 4;
        lVar16 = lVar25 + (long)(int)uVar14 * 4 + (long)memblk;
        pfVar22 = (float *)((long)memblk + lVar25 + lVar8 * 4);
        for (uVar19 = 0; uVar19 != uVar10; uVar19 = uVar19 + 1) {
          for (lVar25 = 0; pfVar20 = pfVar22, lVar17 = lVar8, uVar18 - (long)(int)uVar14 != lVar25;
              lVar25 = lVar25 + 1) {
            *(float *)(lVar16 + lVar25 * 4) = pfVar2[lVar11 + lVar13 + uVar19 * lVar1];
          }
          for (; lVar17 < width + iVar23; lVar17 = lVar17 + 1) {
            *pfVar20 = pfVar2[lVar11 + lVar13 + lVar8 + uVar19 * lVar1 + -1];
            pfVar20 = pfVar20 + 1;
          }
          lVar16 = lVar16 + __n;
          pfVar22 = pfVar22 + lVar1;
        }
        iVar23 = -iVar21;
        if (-1 < iVar21) {
          iVar23 = 0;
        }
        iVar23 = iVar23 + iVar21;
        iVar21 = iVar21 * -in_width;
        while (bVar27 = iVar23 != 0, iVar23 = iVar23 + -1, iVar24 = height * in_width,
              iVar7 = height, bVar27) {
          memcpy(pfVar2 + lVar11 + lVar13 + (iVar21 - cnn_config->ext_width),
                 pfVar2 + lVar11 + (lVar13 - cnn_config->ext_width),__n);
          iVar21 = iVar21 + in_width;
        }
        for (; iVar7 < cnn_config->ext_height + height; iVar7 = iVar7 + 1) {
          memcpy(pfVar2 + lVar11 + lVar13 + (iVar24 - cnn_config->ext_width),
                 pfVar2 + lVar11 + lVar13 + ((height + -1) * in_width - cnn_config->ext_width),__n);
          iVar24 = iVar24 + in_width;
        }
      }
      iVar9 = iVar9 + iVar6;
    }
    _Var5 = av1_cnn_predict_c(inputs,in_width,in_height,in_width,cnn_config,thread_data,output);
    aom_free(memblk);
  }
  return _Var5;
}

Assistant:

bool av1_cnn_predict_img_multi_out_highbd(uint16_t **dgd, int width, int height,
                                          int stride,
                                          const CNN_CONFIG *cnn_config,
                                          const CNN_THREAD_DATA *thread_data,
                                          int bit_depth,
                                          CNN_MULTI_OUT *output) {
  const float max_val = (float)((1 << bit_depth) - 1);

  const int in_width = width + 2 * cnn_config->ext_width;
  const int in_height = height + 2 * cnn_config->ext_height;
  const int in_channels = cnn_config->layer_config[0].in_channels;
  float *inputs[CNN_MAX_CHANNELS];
  float *input_ =
      (float *)aom_malloc(in_width * in_height * in_channels * sizeof(*input_));
  if (!input_) return false;
  const int in_stride = in_width;

  for (int c = 0; c < in_channels; ++c) {
    inputs[c] = input_ + c * in_stride * in_height;
    float *input =
        inputs[c] + cnn_config->ext_height * in_stride + cnn_config->ext_width;

    if (cnn_config->strict_bounds) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
      // extend left and right
      for (int i = 0; i < height; ++i) {
        for (int j = -cnn_config->ext_width; j < 0; ++j)
          input[i * in_stride + j] = input[i * in_stride];
        for (int j = width; j < width + cnn_config->ext_width; ++j)
          input[i * in_stride + j] = input[i * in_stride + width - 1];
      }
      // extend top and bottom
      for (int i = -cnn_config->ext_height; i < 0; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[-cnn_config->ext_width], in_width * sizeof(*input));
      for (int i = height; i < height + cnn_config->ext_height; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[(height - 1) * in_stride - cnn_config->ext_width],
               in_width * sizeof(*input));
    } else {
      for (int i = -cnn_config->ext_height; i < height + cnn_config->ext_height;
           ++i)
        for (int j = -cnn_config->ext_width; j < width + cnn_config->ext_width;
             ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
    }
  }

  bool success = av1_cnn_predict((const float **)inputs, in_width, in_height,
                                 in_stride, cnn_config, thread_data, output);

  aom_free(input_);
  return success;
}